

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_NtkWindow2Solver
              (sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Int_t *vFlip,int PivotVar,int nDivs,int nTimes)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  sat_solver *s;
  int iVar9;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  Vec_Int_t *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  sat_solver *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_60 = CONCAT44(local_60._4_4_,**pCnf->pClauses);
  uVar7 = nTimes - 1;
  uVar1 = nTimes;
  if (nTimes < 3) {
    uVar1 = uVar7;
  }
  local_70 = vFlip;
  iVar2 = sat_solver_nvars(pSat);
  if (iVar2 != 0) {
    __assert_fail("sat_solver_nvars(pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x12f,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  uVar4 = 2;
  if (nTimes < 3) {
    uVar4 = uVar7;
  }
  local_50 = pSat;
  sat_solver_setnvars(pSat,uVar4 * nDivs + pCnf->nVars * nTimes + 2);
  if ((1 < uVar7) && (nTimes != 6)) {
    __assert_fail("nTimes == 1 || nTimes == 2 || nTimes == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x131,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  if (0 < nTimes) {
    local_58 = CONCAT44(local_58._4_4_,1 - nTimes);
    uVar4 = 0;
    do {
      if ((uVar4 & 1) != 0) {
        Cnf_DataLiftAndFlipLits(pCnf,-pCnf->nVars,local_70);
      }
      if (0 < pCnf->nClauses) {
        lVar8 = 0;
        do {
          iVar2 = sat_solver_addclause(local_50,pCnf->pClauses[lVar8],pCnf->pClauses[lVar8 + 1]);
          if (iVar2 == 0) {
            puts("Error: SAT solver became UNSAT at a wrong place.");
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pCnf->nClauses);
      }
      if ((uVar4 & 1) != 0) {
        Cnf_DataLiftAndFlipLits(pCnf,pCnf->nVars,local_70);
      }
      if ((int)uVar4 < (int)uVar7) {
        iVar2 = pCnf->nVars;
LAB_0039f163:
        Cnf_DataLift(pCnf,iVar2);
      }
      else if (uVar4 != 0) {
        iVar2 = pCnf->nVars * (int)local_58;
        goto LAB_0039f163;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != nTimes);
  }
  if ((int)local_60 != **pCnf->pClauses) {
    __assert_fail("Test == pCnf->pClauses[0][0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x140,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  s = local_50;
  if (0 < (int)uVar1) {
    local_80 = 0;
    local_44 = 0;
    local_40 = (ulong)(uint)nTimes;
    do {
      uVar7 = local_44 + 1;
      local_68 = (ulong)uVar7 % (local_40 & 0xffffffff);
      iVar2 = 0;
      if ((local_44 & 1) != 0) {
        iVar2 = nDivs;
      }
      if (0 < nDivs) {
        iVar9 = pCnf->nVars;
        local_68 = (ulong)(uint)((int)local_68 * iVar9);
        uVar5 = local_44 * iVar9;
        uVar4 = iVar9 * (int)local_40 + iVar2;
        iVar6 = uVar4 * 2 + 1;
        iVar9 = iVar9 * local_80;
        uVar3 = 0;
        iVar2 = nDivs;
        local_44 = uVar7;
        do {
          s = local_50;
          uVar7 = (int)uVar3 + (int)local_68;
          if ((int)(uVar7 | uVar5 | uVar4) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x17f,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          local_70 = (Vec_Int_t *)CONCAT44(local_70._4_4_,iVar2);
          local_78 = uVar7 * 2 + 1;
          local_7c = iVar9;
          local_74 = iVar6;
          local_60 = (ulong)uVar4;
          local_58 = (ulong)uVar5;
          local_38 = uVar3;
          iVar2 = sat_solver_addclause(local_50,&local_7c,(lit *)&local_70);
          if (iVar2 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x185,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          local_78 = uVar7 * 2;
          local_7c = iVar9 + 1;
          local_74 = iVar6;
          iVar2 = sat_solver_addclause(s,&local_7c,(lit *)&local_70);
          if (iVar2 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x18b,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          uVar3 = (ulong)((int)local_38 + 1);
          iVar6 = iVar6 + 2;
          uVar4 = (int)local_60 + 1;
          iVar9 = iVar9 + 2;
          uVar5 = (int)local_58 + 1;
          iVar2 = (int)local_70 + -1;
          uVar7 = local_44;
        } while (iVar2 != 0);
      }
      local_44 = uVar7;
      local_80 = local_80 + 2;
    } while (local_44 != uVar1);
  }
  iVar2 = sat_solver_simplify(s);
  if (iVar2 == 0) {
    puts("Error: SAT solver became UNSAT at a wrong place.");
  }
  return 1;
}

Assistant:

int Acb_NtkWindow2Solver( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Int_t * vFlip, int PivotVar, int nDivs, int nTimes )
{
    int n, i, RetValue, Test = pCnf->pClauses[0][0];
    int nGroups = nTimes <= 2 ? nTimes-1 : 2;
    int nRounds = nTimes <= 2 ? nTimes-1 : nTimes;
    assert( sat_solver_nvars(pSat) == 0 );
    sat_solver_setnvars( pSat, nTimes * pCnf->nVars + nGroups * nDivs + 2 );
    assert( nTimes == 1 || nTimes == 2 || nTimes == 6 );
    for ( n = 0; n < nTimes; n++ )
    {
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, -pCnf->nVars, vFlip );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, pCnf->nVars, vFlip );
        if ( n < nTimes - 1 )
            Cnf_DataLift( pCnf, pCnf->nVars );
        else if ( n ) // if ( n == nTimes - 1 )
            Cnf_DataLift( pCnf, -(nTimes - 1) * pCnf->nVars );
    }
    assert( Test == pCnf->pClauses[0][0] );
    // add conditional buffers
    for ( n = 0; n < nRounds; n++ )
    {
        int BaseA = n * pCnf->nVars;
        int BaseB = ((n + 1) % nTimes) * pCnf->nVars;
        int BaseC = nTimes * pCnf->nVars + (n & 1) * nDivs;
        for ( i = 0; i < nDivs; i++ )
            sat_solver_add_buffer_enable( pSat, BaseA + i, BaseB + i, BaseC + i, 0 );
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( !RetValue ) printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
    return 1;
}